

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
nlohmann::json_schema::json_validator::json_validator
          (json_validator *this,json *schema,schema_loader *loader,format_checker *format,
          content_checker *content)

{
  _Manager_type p_Var1;
  _Head_base<0UL,_nlohmann::json_schema::root_schema_*,_false> this_00;
  pointer *__ptr;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type local_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  local_50 = loader->_M_invoker;
  p_Var1 = (loader->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(loader->super__Function_base)._M_functor
    ;
    local_68._8_8_ = *(undefined8 *)((long)&(loader->super__Function_base)._M_functor + 8);
    (loader->super__Function_base)._M_manager = (_Manager_type)0x0;
    loader->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var1;
  }
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  local_70 = format->_M_invoker;
  p_Var1 = (format->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_88._M_unused._0_8_ = (undefined8)*(undefined8 *)&(format->super__Function_base)._M_functor
    ;
    local_88._8_8_ = *(undefined8 *)((long)&(format->super__Function_base)._M_functor + 8);
    (format->super__Function_base)._M_manager = (_Manager_type)0x0;
    format->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var1;
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = content->_M_invoker;
  p_Var1 = (content->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(content->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(content->super__Function_base)._M_functor + 8);
    (content->super__Function_base)._M_manager = (_Manager_type)0x0;
    content->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  this_00._M_head_impl = (root_schema *)operator_new(0xa0);
  root_schema::root_schema
            (this_00._M_head_impl,(schema_loader *)&local_68,(format_checker *)&local_88,
             (content_checker *)&local_48);
  (this->root_)._M_t.
  super___uniq_ptr_impl<nlohmann::json_schema::root_schema,_std::default_delete<nlohmann::json_schema::root_schema>_>
  ._M_t.
  super__Tuple_impl<0UL,_nlohmann::json_schema::root_schema_*,_std::default_delete<nlohmann::json_schema::root_schema>_>
  .super__Head_base<0UL,_nlohmann::json_schema::root_schema_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  set_root_schema(this,schema);
  return;
}

Assistant:

json_validator::json_validator(const json &schema,
                               schema_loader loader,
                               format_checker format,
                               content_checker content)
    : json_validator(std::move(loader),
                     std::move(format),
                     std::move(content))
{
	set_root_schema(schema);
}